

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_type(connectdata *conn)

{
  void *pvVar1;
  SessionHandle *pSVar2;
  int iVar3;
  ftp_conn *ftpc;
  SessionHandle *data;
  FTP *ftp;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  pSVar2 = conn->data;
  if (((((pSVar2->set).opt_no_body & 1U) == 0) || ((conn->proto).ftpc.file == (char *)0x0)) ||
     (iVar3 = ftp_need_type(conn,(_Bool)((pSVar2->set).prefer_ascii & 1)), iVar3 == 0)) {
    ftp._4_4_ = ftp_state_size(conn);
  }
  else {
    *(undefined4 *)((long)pvVar1 + 0x18) = 1;
    ftp._4_4_ = ftp_nb_type(conn,(_Bool)((pSVar2->set).prefer_ascii & 1),FTP_TYPE);
    if (ftp._4_4_ != CURLE_OK) {
      return ftp._4_4_;
    }
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_type(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct SessionHandle *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which in FTP can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && ftpc->file &&
     ftp_need_type(conn, data->set.prefer_ascii)) {
    /* The SIZE command is _not_ RFC 959 specified, and therefor many servers
       may not support it! It is however the only way we have to get a file's
       size! */

    ftp->transfer = FTPTRANSFER_INFO;
    /* this means no actual transfer will be made */

    /* Some servers return different sizes for different modes, and thus we
       must set the proper type before we check the size */
    result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_TYPE);
    if(result)
      return result;
  }
  else
    result = ftp_state_size(conn);

  return result;
}